

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::rc::Texture2DArray::Texture2DArray(Texture2DArray *this,deUint32 name)

{
  (this->super_Texture).super_NamedObject.m_name = name;
  *(undefined8 *)&(this->super_Texture).super_NamedObject.m_refCount = 0x300000001;
  (this->super_Texture).m_immutable = false;
  (this->super_Texture).m_sampler.wrapS = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapT = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapR = REPEAT_GL;
  (this->super_Texture).m_sampler.minFilter = NEAREST_MIPMAP_LINEAR;
  (this->super_Texture).m_sampler.magFilter = LINEAR;
  (this->super_Texture).m_sampler.lodThreshold = 0.0;
  (this->super_Texture).m_sampler.normalizedCoords = true;
  (this->super_Texture).m_sampler.compare = COMPAREMODE_NONE;
  (this->super_Texture).m_sampler.compareChannel = 0;
  *(undefined8 *)&(this->super_Texture).m_sampler.borderColor.v = 0;
  *(undefined8 *)((long)&(this->super_Texture).m_sampler.borderColor.v + 8) = 0;
  (this->super_Texture).m_sampler.seamlessCubeMap = true;
  *(undefined8 *)&(this->super_Texture).m_sampler.depthStencilMode = 0;
  (this->super_Texture).m_maxLevel = 1000;
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture2DArray_00b4f950;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::Texture2DArrayView::Texture2DArrayView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

Texture2DArray::Texture2DArray (deUint32 name)
	: Texture	(name, TYPE_2D_ARRAY)
	, m_view	(0, DE_NULL)
{
}